

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O0

void idct16_stage7_sse2(__m128i *output,__m128i *x)

{
  undefined1 auVar1 [16];
  undefined1 (*in_RSI) [16];
  undefined1 (*in_RDI) [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  __m128i _in1_3;
  __m128i _in0_3;
  __m128i _in1_2;
  __m128i _in0_2;
  __m128i _in1_1;
  __m128i _in0_1;
  __m128i _in1;
  __m128i _in0;
  __m128i _in1_7;
  __m128i _in0_7;
  __m128i _in1_6;
  __m128i _in0_6;
  __m128i _in1_5;
  __m128i _in0_5;
  __m128i _in1_4;
  __m128i _in0_4;
  
  auVar3 = *in_RSI;
  auVar1 = in_RSI[0xf];
  auVar2 = paddsw(*in_RSI,in_RSI[0xf]);
  *in_RDI = auVar2;
  auVar3 = psubsw(auVar3,auVar1);
  in_RDI[0xf] = auVar3;
  auVar3 = in_RSI[1];
  auVar1 = in_RSI[0xe];
  auVar2 = paddsw(in_RSI[1],in_RSI[0xe]);
  in_RDI[1] = auVar2;
  auVar3 = psubsw(auVar3,auVar1);
  in_RDI[0xe] = auVar3;
  auVar3 = in_RSI[2];
  auVar1 = in_RSI[0xd];
  auVar2 = paddsw(in_RSI[2],in_RSI[0xd]);
  in_RDI[2] = auVar2;
  auVar3 = psubsw(auVar3,auVar1);
  in_RDI[0xd] = auVar3;
  auVar3 = in_RSI[3];
  auVar1 = in_RSI[0xc];
  auVar2 = paddsw(in_RSI[3],in_RSI[0xc]);
  in_RDI[3] = auVar2;
  auVar3 = psubsw(auVar3,auVar1);
  in_RDI[0xc] = auVar3;
  auVar3 = in_RSI[4];
  auVar1 = in_RSI[0xb];
  auVar2 = paddsw(in_RSI[4],in_RSI[0xb]);
  in_RDI[4] = auVar2;
  auVar3 = psubsw(auVar3,auVar1);
  in_RDI[0xb] = auVar3;
  auVar3 = in_RSI[5];
  auVar1 = in_RSI[10];
  auVar2 = paddsw(in_RSI[5],in_RSI[10]);
  in_RDI[5] = auVar2;
  auVar3 = psubsw(auVar3,auVar1);
  in_RDI[10] = auVar3;
  auVar3 = in_RSI[6];
  auVar1 = in_RSI[9];
  auVar2 = paddsw(in_RSI[6],in_RSI[9]);
  in_RDI[6] = auVar2;
  auVar3 = psubsw(auVar3,auVar1);
  in_RDI[9] = auVar3;
  auVar3 = in_RSI[7];
  auVar1 = in_RSI[8];
  auVar2 = paddsw(in_RSI[7],in_RSI[8]);
  in_RDI[7] = auVar2;
  auVar3 = psubsw(auVar3,auVar1);
  in_RDI[8] = auVar3;
  return;
}

Assistant:

static inline void idct16_stage7_sse2(__m128i *output, __m128i *x) {
  btf_16_adds_subs_out_sse2(output[0], output[15], x[0], x[15]);
  btf_16_adds_subs_out_sse2(output[1], output[14], x[1], x[14]);
  btf_16_adds_subs_out_sse2(output[2], output[13], x[2], x[13]);
  btf_16_adds_subs_out_sse2(output[3], output[12], x[3], x[12]);
  btf_16_adds_subs_out_sse2(output[4], output[11], x[4], x[11]);
  btf_16_adds_subs_out_sse2(output[5], output[10], x[5], x[10]);
  btf_16_adds_subs_out_sse2(output[6], output[9], x[6], x[9]);
  btf_16_adds_subs_out_sse2(output[7], output[8], x[7], x[8]);
}